

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

size_t __thiscall re2::DFA::StateHash::operator()(StateHash *this,State *a)

{
  size_t sVar1;
  long *in_RSI;
  int i;
  HashMix mix;
  int local_1c;
  HashMix local_18;
  long *local_10;
  
  local_10 = in_RSI;
  HashMix::HashMix(&local_18,(ulong)*(uint *)((long)in_RSI + 0xc));
  for (local_1c = 0; local_1c < (int)local_10[1]; local_1c = local_1c + 1) {
    HashMix::Mix(&local_18,(long)*(int *)(*local_10 + (long)local_1c * 4));
  }
  HashMix::Mix(&local_18,0);
  sVar1 = HashMix::get(&local_18);
  return sVar1;
}

Assistant:

size_t operator()(const State* a) const {
      DCHECK(a != NULL);
      HashMix mix(a->flag_);
      for (int i = 0; i < a->ninst_; i++)
        mix.Mix(a->inst_[i]);
      mix.Mix(0);
      return mix.get();
    }